

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

void __thiscall
wabt::Decompiler::BracketIfNeeded(Decompiler *this,Value *val,Precedence parent_precedence)

{
  string_view postfix;
  Value *child;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  string_view local_50;
  Value local_40;
  Precedence local_1c;
  Value *pVStack_18;
  Precedence parent_precedence_local;
  Value *val_local;
  Decompiler *this_local;
  
  if (((int)val->precedence <= (int)parent_precedence) &&
     ((local_1c = parent_precedence, pVStack_18 = val, val_local = (Value *)this,
      parent_precedence != val->precedence || (bVar1 = Associative(this,parent_precedence), !bVar1))
     )) {
    child = pVStack_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"(");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,")");
    postfix._M_str = local_60._M_str;
    postfix._M_len = local_60._M_len;
    WrapChild(&local_40,this,child,local_50,postfix,Atomic);
    Value::operator=(pVStack_18,&local_40);
    Value::~Value(&local_40);
  }
  return;
}

Assistant:

void BracketIfNeeded(Value& val, Precedence parent_precedence) {
    if (parent_precedence < val.precedence ||
        (parent_precedence == val.precedence &&
         Associative(parent_precedence))) {
      return;
    }
    val = WrapChild(val, "(", ")", Precedence::Atomic);
  }